

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomProperty::write(DomProperty *this,int __fd,void *__buf,size_t __n)

{
  double dVar1;
  long lVar2;
  DomString *this_00;
  DomSizePolicy *this_01;
  DomRect *this_02;
  DomPalette *this_03;
  DomRectF *this_04;
  DomPointF *this_05;
  DomSize *this_06;
  DomResourceIcon *this_07;
  DomColor *this_08;
  DomStringList *this_09;
  DomDate *this_10;
  DomLocale *this_11;
  DomFont *this_12;
  DomPoint *this_13;
  DomResourcePixmap *this_14;
  DomBrush *this_15;
  DomTime *this_16;
  DomDateTime *this_17;
  DomChar *this_18;
  DomUrl *this_19;
  DomSizeF *this_20;
  uint *__n_00;
  char16_t *pcVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  int iVar5;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar6._4_4_ = in_register_00000034;
  aVar6._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)((long)__buf + 0x10);
  if (lVar2 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_50.ptr = L"property";
    local_68.size = 0;
    local_50.size = 8;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar11.m_size = (size_t)local_50.ptr;
  QVar11.field_0.m_data = aVar6.m_data;
  QXmlStreamWriter::writeStartElement(QVar11);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar2 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (this->m_has_attr_name == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"name",4);
    QVar7.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_name).d.d;
    local_80.ptr = (this->m_attr_name).d.ptr;
    local_80.size = (this->m_attr_name).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar7.m_size = (size_t)local_80.ptr;
    QVar12.m_size = (size_t)local_50.ptr;
    QVar12.field_0.m_data = aVar6.m_data;
    QXmlStreamWriter::writeAttribute(QVar12,QVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_stdset == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"stdset",6);
    pcVar3 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_stdset);
    QVar8.m_size = (size_t)local_80.ptr;
    QVar8.field_0.m_data = aVar4.m_data;
    QVar13.m_size = (size_t)pcVar3;
    QVar13.field_0.m_data = aVar6.m_data;
    QXmlStreamWriter::writeAttribute(QVar13,QVar8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  __n_00 = &switchD_001525ae::switchdataD_001763d0;
  switch(this->m_kind) {
  case Bool:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"bool",4);
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_bool).d.d;
    local_80.ptr = (this->m_bool).d.ptr;
    local_80.size = (this->m_bool).d.size;
    goto LAB_00152a19;
  case Color:
    this_08 = this->m_color;
    if (this_08 == (DomColor *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"color",5);
    DomColor::write(this_08,__fd,&local_50,(size_t)__n_00);
    break;
  case Cstring:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"cstring",7);
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_cstring).d.d;
    local_80.ptr = (this->m_cstring).d.ptr;
    local_80.size = (this->m_cstring).d.size;
    goto LAB_00152a19;
  case Cursor:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"cursor",6);
    iVar5 = this->m_cursor;
    goto LAB_00152b28;
  case CursorShape:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"cursorShape",0xb);
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_cursorShape).d.d;
    local_80.ptr = (this->m_cursorShape).d.ptr;
    local_80.size = (this->m_cursorShape).d.size;
    goto LAB_00152a19;
  case Enum:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"enum",4);
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_enum).d.d;
    local_80.ptr = (this->m_enum).d.ptr;
    local_80.size = (this->m_enum).d.size;
    goto LAB_00152a19;
  case Font:
    this_12 = this->m_font;
    if (this_12 == (DomFont *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"font",4);
    DomFont::write(this_12,__fd,&local_50,(size_t)__n_00);
    break;
  case IconSet:
    this_07 = this->m_iconSet;
    if (this_07 == (DomResourceIcon *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"iconset",7);
    DomResourceIcon::write(this_07,__fd,&local_50,(size_t)__n_00);
    break;
  case Pixmap:
    this_14 = this->m_pixmap;
    if (this_14 == (DomResourcePixmap *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"pixmap",6);
    DomResourcePixmap::write(this_14,__fd,&local_50,(size_t)__n_00);
    break;
  case Palette:
    this_03 = this->m_palette;
    if (this_03 == (DomPalette *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"palette",7);
    DomPalette::write(this_03,__fd,&local_50,(size_t)__n_00);
    break;
  case Point:
    this_13 = this->m_point;
    if (this_13 == (DomPoint *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"point",5);
    DomPoint::write(this_13,__fd,&local_50,(size_t)__n_00);
    break;
  case Rect:
    this_02 = this->m_rect;
    if (this_02 == (DomRect *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"rect",4);
    DomRect::write(this_02,__fd,&local_50,(size_t)__n_00);
    break;
  case Set:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"set",3);
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_set).d.d;
    local_80.ptr = (this->m_set).d.ptr;
    local_80.size = (this->m_set).d.size;
LAB_00152a19:
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar9.m_size = (size_t)local_80.ptr;
    QVar9.field_0.m_data = aVar4.m_data;
    QVar14.m_size = (size_t)local_50.ptr;
    QVar14.field_0.m_data = aVar6.m_data;
    QXmlStreamWriter::writeTextElement(QVar14,QVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    break;
  case Locale:
    this_11 = this->m_locale;
    if (this_11 == (DomLocale *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"locale",6);
    DomLocale::write(this_11,__fd,&local_50,(size_t)__n_00);
    break;
  case SizePolicy:
    this_01 = this->m_sizePolicy;
    if (this_01 == (DomSizePolicy *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"sizepolicy",10);
    DomSizePolicy::write(this_01,__fd,&local_50,(size_t)__n_00);
    break;
  case Size:
    this_06 = this->m_size;
    if (this_06 == (DomSize *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"size",4);
    DomSize::write(this_06,__fd,&local_50,(size_t)__n_00);
    break;
  case String:
    this_00 = this->m_string;
    if (this_00 == (DomString *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"string",6);
    DomString::write(this_00,__fd,&local_50,(size_t)__n_00);
    break;
  case StringList:
    this_09 = this->m_stringList;
    if (this_09 == (DomStringList *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"stringlist",10);
    DomStringList::write(this_09,__fd,&local_50,(size_t)__n_00);
    break;
  case Number:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"number",6);
    iVar5 = this->m_number;
LAB_00152b28:
    pcVar3 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,iVar5);
    goto LAB_00152ca5;
  case Float:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"float",5);
    dVar1 = (double)this->m_float;
    goto LAB_00152c9c;
  case Double:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"double",6);
    dVar1 = this->m_double;
LAB_00152c9c:
    pcVar3 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number(dVar1,(char)&local_80,0x66);
    goto LAB_00152ca5;
  case Date:
    this_10 = this->m_date;
    if (this_10 == (DomDate *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"date",4);
    DomDate::write(this_10,__fd,&local_50,(size_t)__n_00);
    break;
  case Time:
    this_16 = this->m_time;
    if (this_16 == (DomTime *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"time",4);
    DomTime::write(this_16,__fd,&local_50,(size_t)__n_00);
    break;
  case DateTime:
    this_17 = this->m_dateTime;
    if (this_17 == (DomDateTime *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"datetime",8);
    DomDateTime::write(this_17,__fd,&local_50,(size_t)__n_00);
    break;
  case PointF:
    this_05 = this->m_pointF;
    if (this_05 == (DomPointF *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"pointf",6);
    DomPointF::write(this_05,__fd,&local_50,(size_t)__n_00);
    break;
  case RectF:
    this_04 = this->m_rectF;
    if (this_04 == (DomRectF *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"rectf",5);
    DomRectF::write(this_04,__fd,&local_50,(size_t)__n_00);
    break;
  case SizeF:
    this_20 = this->m_sizeF;
    if (this_20 == (DomSizeF *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"sizef",5);
    DomSizeF::write(this_20,__fd,&local_50,(size_t)__n_00);
    break;
  case LongLong:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"longLong",8);
    pcVar3 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((longlong)&local_80,(int)this->m_longLong);
    goto LAB_00152ca5;
  case Char:
    this_18 = this->m_char;
    if (this_18 == (DomChar *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"char",4);
    DomChar::write(this_18,__fd,&local_50,(size_t)__n_00);
    break;
  case Url:
    this_19 = this->m_url;
    if (this_19 == (DomUrl *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"url",3);
    DomUrl::write(this_19,__fd,&local_50,(size_t)__n_00);
    break;
  case UInt:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"UInt",4);
    pcVar3 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((uint)&local_80,this->m_UInt);
    goto LAB_00152ca5;
  case ULongLong:
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"uLongLong",9);
    pcVar3 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((ulonglong)&local_80,(int)this->m_uLongLong);
LAB_00152ca5:
    QVar10.m_size = (size_t)local_80.ptr;
    QVar10.field_0.m_data = aVar4.m_data;
    QVar15.m_size = (size_t)pcVar3;
    QVar15.field_0.m_data = aVar6.m_data;
    QXmlStreamWriter::writeTextElement(QVar15,QVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    break;
  case Brush:
    this_15 = this->m_brush;
    if (this_15 == (DomBrush *)0x0) goto switchD_001525ae_default;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"brush",5);
    DomBrush::write(this_15,__fd,&local_50,(size_t)__n_00);
    break;
  default:
    goto switchD_001525ae_default;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
switchD_001525ae_default:
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomProperty::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("property") : tagName.toLower());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    if (hasAttributeStdset())
        writer.writeAttribute(u"stdset"_s, QString::number(attributeStdset()));

    switch (kind()) {
    case Bool:
        writer.writeTextElement(u"bool"_s, elementBool());
        break;

    case Color:
        if (m_color != nullptr)
            m_color->write(writer, u"color"_s);
        break;

    case Cstring:
        writer.writeTextElement(u"cstring"_s, elementCstring());
        break;

    case Cursor:
        writer.writeTextElement(u"cursor"_s, QString::number(elementCursor()));
        break;

    case CursorShape:
        writer.writeTextElement(u"cursorShape"_s, elementCursorShape());
        break;

    case Enum:
        writer.writeTextElement(u"enum"_s, elementEnum());
        break;

    case Font:
        if (m_font != nullptr)
            m_font->write(writer, u"font"_s);
        break;

    case IconSet:
        if (m_iconSet != nullptr)
            m_iconSet->write(writer, u"iconset"_s);
        break;

    case Pixmap:
        if (m_pixmap != nullptr)
            m_pixmap->write(writer, u"pixmap"_s);
        break;

    case Palette:
        if (m_palette != nullptr)
            m_palette->write(writer, u"palette"_s);
        break;

    case Point:
        if (m_point != nullptr)
            m_point->write(writer, u"point"_s);
        break;

    case Rect:
        if (m_rect != nullptr)
            m_rect->write(writer, u"rect"_s);
        break;

    case Set:
        writer.writeTextElement(u"set"_s, elementSet());
        break;

    case Locale:
        if (m_locale != nullptr)
            m_locale->write(writer, u"locale"_s);
        break;

    case SizePolicy:
        if (m_sizePolicy != nullptr)
            m_sizePolicy->write(writer, u"sizepolicy"_s);
        break;

    case Size:
        if (m_size != nullptr)
            m_size->write(writer, u"size"_s);
        break;

    case String:
        if (m_string != nullptr)
            m_string->write(writer, u"string"_s);
        break;

    case StringList:
        if (m_stringList != nullptr)
            m_stringList->write(writer, u"stringlist"_s);
        break;

    case Number:
        writer.writeTextElement(u"number"_s, QString::number(elementNumber()));
        break;

    case Float:
        writer.writeTextElement(u"float"_s, QString::number(elementFloat(), 'f', 8));
        break;

    case Double:
        writer.writeTextElement(u"double"_s, QString::number(elementDouble(), 'f', 15));
        break;

    case Date:
        if (m_date != nullptr)
            m_date->write(writer, u"date"_s);
        break;

    case Time:
        if (m_time != nullptr)
            m_time->write(writer, u"time"_s);
        break;

    case DateTime:
        if (m_dateTime != nullptr)
            m_dateTime->write(writer, u"datetime"_s);
        break;

    case PointF:
        if (m_pointF != nullptr)
            m_pointF->write(writer, u"pointf"_s);
        break;

    case RectF:
        if (m_rectF != nullptr)
            m_rectF->write(writer, u"rectf"_s);
        break;

    case SizeF:
        if (m_sizeF != nullptr)
            m_sizeF->write(writer, u"sizef"_s);
        break;

    case LongLong:
        writer.writeTextElement(u"longLong"_s, QString::number(elementLongLong()));
        break;

    case Char:
        if (m_char != nullptr)
            m_char->write(writer, u"char"_s);
        break;

    case Url:
        if (m_url != nullptr)
            m_url->write(writer, u"url"_s);
        break;

    case UInt:
        writer.writeTextElement(u"UInt"_s, QString::number(elementUInt()));
        break;

    case ULongLong:
        writer.writeTextElement(u"uLongLong"_s, QString::number(elementULongLong()));
        break;

    case Brush:
        if (m_brush != nullptr)
            m_brush->write(writer, u"brush"_s);
        break;

    default:
        break;
    }
    writer.writeEndElement();
}